

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O0

Gia_Man_t * Gia_ManFraigCreateGia(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  int iLit1;
  Gia_Obj_t *pGVar3;
  Vec_Int_t *p_00;
  Gia_Man_t *p_01;
  char *pcVar4;
  void *pvVar5;
  Gia_Man_t *pGVar6;
  bool bVar7;
  int local_30;
  int local_2c;
  int fLabelPos;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Vec_Int_t *vBoxPres;
  Gia_Man_t *p_local;
  
  if (p->pManTime == (void *)0x0) {
    __assert_fail("p->pManTime != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                  ,0x104,"Gia_Man_t *Gia_ManFraigCreateGia(Gia_Man_t *)");
  }
  Gia_ManIncrementTravId(p);
  pGVar3 = Gia_ManConst0(p);
  Gia_ObjSetTravIdCurrent(p,pGVar3);
  p_00 = Vec_IntAlloc(1000);
  local_30 = 1;
  iVar1 = Gia_ManObjNum(p);
  _fLabelPos = Gia_ManObj(p,iVar1 + -1);
  iVar1 = Gia_ObjIsCo(_fLabelPos);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsCo(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                  ,0x10c,"Gia_Man_t *Gia_ManFraigCreateGia(Gia_Man_t *)");
  }
  while (iVar1 = Gia_ObjIsCo(_fLabelPos), iVar1 != 0) {
    _fLabelPos = Gia_ManFraigMarkCos(p,_fLabelPos,local_30);
    iVar1 = Gia_ObjIsAnd(_fLabelPos);
    if (iVar1 != 0) {
      _fLabelPos = Gia_ManFraigMarkAnd(p,_fLabelPos);
    }
    iVar1 = Gia_ObjIsCi(_fLabelPos);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsCi(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                    ,0x112,"Gia_Man_t *Gia_ManFraigCreateGia(Gia_Man_t *)");
    }
    local_30 = Gia_ManFraigCheckCis(p,_fLabelPos);
    _fLabelPos = Gia_ManFraigMarkCis(p,_fLabelPos,local_30);
    Vec_IntPush(p_00,local_30);
  }
  Vec_IntPop(p_00);
  Vec_IntReverseOrder(p_00);
  iVar1 = Gia_ObjIsConst0(_fLabelPos);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsConst0(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                  ,0x119,"Gia_Man_t *Gia_ManFraigCreateGia(Gia_Man_t *)");
  }
  local_2c = 1;
  while( true ) {
    bVar7 = false;
    if (local_2c < p->nObjs) {
      _fLabelPos = Gia_ManObj(p,local_2c);
      bVar7 = _fLabelPos != (Gia_Obj_t *)0x0;
    }
    if ((!bVar7) || (iVar1 = Gia_ObjIsCi(_fLabelPos), iVar1 == 0)) break;
    Gia_ObjSetTravIdCurrent(p,_fLabelPos);
    local_2c = local_2c + 1;
  }
  iVar1 = Gia_ManObjNum(p);
  p_01 = Gia_ManStart(iVar1);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_01->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_01->pSpec = pcVar4;
  pGVar3 = Gia_ManConst0(p);
  pGVar3->Value = 0;
  local_2c = 1;
  while( true ) {
    bVar7 = false;
    if (local_2c < p->nObjs) {
      _fLabelPos = Gia_ManObj(p,local_2c);
      bVar7 = _fLabelPos != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar1 = Gia_ObjIsTravIdCurrent(p,_fLabelPos);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjIsCi(_fLabelPos);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsAnd(_fLabelPos);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjIsCo(_fLabelPos);
          if (iVar1 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                          ,0x12f,"Gia_Man_t *Gia_ManFraigCreateGia(Gia_Man_t *)");
          }
          iVar1 = Gia_ObjFanin0Copy(_fLabelPos);
          uVar2 = Gia_ManAppendCo(p_01,iVar1);
          _fLabelPos->Value = uVar2;
        }
        else {
          iVar1 = Gia_ObjFanin0Copy(_fLabelPos);
          iLit1 = Gia_ObjFanin1Copy(_fLabelPos);
          uVar2 = Gia_ManAppendAnd(p_01,iVar1,iLit1);
          _fLabelPos->Value = uVar2;
        }
      }
      else {
        uVar2 = Gia_ManAppendCi(p_01);
        _fLabelPos->Value = uVar2;
      }
    }
    local_2c = local_2c + 1;
  }
  pvVar5 = Gia_ManUpdateTimMan(p,p_00);
  p_01->pManTime = pvVar5;
  if (p->pAigExtra == (Gia_Man_t *)0x0) {
    __assert_fail("p->pAigExtra != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                  ,0x134,"Gia_Man_t *Gia_ManFraigCreateGia(Gia_Man_t *)");
  }
  if (p_01->pAigExtra != (Gia_Man_t *)0x0) {
    __assert_fail("pNew->pAigExtra == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                  ,0x135,"Gia_Man_t *Gia_ManFraigCreateGia(Gia_Man_t *)");
  }
  pGVar6 = Gia_ManUpdateExtraAig(p->pManTime,p->pAigExtra,p_00);
  p_01->pAigExtra = pGVar6;
  Vec_IntFree(p_00);
  return p_01;
}

Assistant:

Gia_Man_t * Gia_ManFraigCreateGia( Gia_Man_t * p )
{
    Vec_Int_t * vBoxPres;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i, fLabelPos;
    assert( p->pManTime != NULL );
    // start marks
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    vBoxPres = Vec_IntAlloc( 1000 );
    // mark primary outputs
    fLabelPos = 1;
    pObj = Gia_ManObj( p, Gia_ManObjNum(p) - 1 );
    assert( Gia_ObjIsCo(pObj) );
    while ( Gia_ObjIsCo(pObj) )
    {
        pObj = Gia_ManFraigMarkCos( p, pObj, fLabelPos );
        if ( Gia_ObjIsAnd(pObj) )
            pObj = Gia_ManFraigMarkAnd( p, pObj );
        assert( Gia_ObjIsCi(pObj) );
        fLabelPos = Gia_ManFraigCheckCis(p, pObj);
        pObj = Gia_ManFraigMarkCis( p, pObj, fLabelPos );
        Vec_IntPush( vBoxPres, fLabelPos );
    }
    Vec_IntPop( vBoxPres );
    Vec_IntReverseOrder( vBoxPres );
    assert( Gia_ObjIsConst0(pObj) );
    // mark primary inputs
    Gia_ManForEachObj1( p, pObj, i )
        if ( Gia_ObjIsCi(pObj) )
            Gia_ObjSetTravIdCurrent( p, pObj );
        else
            break;
    // duplicate marked entries
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( !Gia_ObjIsTravIdCurrent(p, pObj) )
            continue;
        if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi(pNew);
        else if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        else assert( 0 );
    }
    // update timing manager
    pNew->pManTime = Gia_ManUpdateTimMan( p, vBoxPres );
    // update extra STG
    assert( p->pAigExtra != NULL );
    assert( pNew->pAigExtra == NULL );
    pNew->pAigExtra = Gia_ManUpdateExtraAig( p->pManTime, p->pAigExtra, vBoxPres );
    Vec_IntFree( vBoxPres );
//    assert( Gia_ManPiNum(pNew) == Tim_ManCiNum(pNew->pManTime) );
//    assert( Gia_ManPoNum(pNew) == Tim_ManCoNum(pNew->pManTime) );
//    assert( Gia_ManPiNum(pNew) == Tim_ManPiNum(pNew->pManTime) + Gia_ManPoNum(pNew->pAigExtra) );
    return pNew;
}